

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucharstrie.cpp
# Opt level: O0

void icu_63::UCharsTrie::getNextBranchUChars(UChar *pos,int32_t length,Appendable *out)

{
  char16_t *pos_00;
  Appendable *out_local;
  UChar *pUStack_10;
  int32_t length_local;
  UChar *pos_local;
  
  out_local._4_4_ = length;
  pUStack_10 = pos;
  while (5 < out_local._4_4_) {
    pos_00 = jumpByDelta(pUStack_10 + 1);
    getNextBranchUChars(pos_00,out_local._4_4_ >> 1,out);
    out_local._4_4_ = out_local._4_4_ - (out_local._4_4_ >> 1);
    pUStack_10 = skipDelta(pUStack_10 + 1);
  }
  do {
    (*(out->super_UObject)._vptr_UObject[3])(out,(ulong)(ushort)*pUStack_10);
    pUStack_10 = skipValue(pUStack_10 + 1);
    out_local._4_4_ = out_local._4_4_ + -1;
  } while (1 < out_local._4_4_);
  (*(out->super_UObject)._vptr_UObject[3])(out,(ulong)(ushort)*pUStack_10);
  return;
}

Assistant:

void
UCharsTrie::getNextBranchUChars(const UChar *pos, int32_t length, Appendable &out) {
    while(length>kMaxBranchLinearSubNodeLength) {
        ++pos;  // ignore the comparison unit
        getNextBranchUChars(jumpByDelta(pos), length>>1, out);
        length=length-(length>>1);
        pos=skipDelta(pos);
    }
    do {
        out.appendCodeUnit(*pos++);
        pos=skipValue(pos);
    } while(--length>1);
    out.appendCodeUnit(*pos);
}